

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

int log_write_impl_va(char *name,size_t line,char *func,char *file,log_level_id level,char *message,
                     ...)

{
  char in_AL;
  log_level_id lVar1;
  int iVar2;
  log_impl impl;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  log_record_va_list_type variable_args;
  log_record_ctor_type record_ctor;
  __va_list_tag local_130;
  log_record_ctor_type local_118;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  impl = log_singleton_get(name);
  iVar2 = 0;
  if (impl != (log_impl)0x0) {
    lVar1 = log_impl_level(impl);
    iVar2 = 0;
    if (lVar1 <= level) {
      local_130.reg_save_area = local_e8;
      local_118.variable_args = (log_record_va_list_type *)&local_130;
      local_130.overflow_arg_area = &variable_args;
      local_130.gp_offset = 0x30;
      local_130.fp_offset = 0x30;
      local_118.line = line;
      local_118.func = func;
      local_118.file = file;
      local_118.level = level;
      local_118.message = message;
      iVar2 = log_impl_write(impl,&local_118);
    }
  }
  return iVar2;
}

Assistant:

int log_write_impl_va(const char *name, const size_t line, const char *func, const char *file, const enum log_level_id level, const char *message, ...)
{
	log_impl impl = log_singleton_get(name);

	struct log_record_ctor_type record_ctor;

	int result;

	enum log_level_id impl_level;

	struct log_record_va_list_type variable_args;

	if (impl == NULL)
	{
		return 0;
	}

	impl_level = log_impl_level(impl);

	if (impl == NULL)
	{
		return 1;
	}

	if (level < impl_level)
	{
		return 0;
	}

	va_start(variable_args.data, message);

	record_ctor.line = line;
	record_ctor.func = func;
	record_ctor.file = file;
	record_ctor.level = level;
	record_ctor.message = message;
	record_ctor.variable_args = &variable_args;

	result = log_impl_write(impl, &record_ctor);

	va_end(variable_args.data);

	return result;
}